

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_flat_map.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
 __thiscall
chaiscript::utility::
QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
::insert_or_assign<chaiscript::Boxed_Value>
          (QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          Boxed_Value *m)

{
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  _Var1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
  pVar3;
  
  _Var1 = QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>::
          find<std::__cxx11::string>
                    ((QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>
                      *)this,key);
  if (_Var1._M_current ==
      (this->data).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    grow(this);
    _Var1._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
          *)std::
            vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>
            ::_M_emplace_aux<std::__cxx11::string_const&,chaiscript::Boxed_Value>
                      ((vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>
                        *)&this->data,
                       (this->data).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,key,m);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               &(_Var1._M_current)->second,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)m);
    uVar2 = 0;
  }
  pVar3._8_8_ = uVar2;
  pVar3.first._M_current = _Var1._M_current;
  return pVar3;
}

Assistant:

auto insert_or_assign(const Key &key, M &&m) {
      if (auto itr = find(key); itr != data.end()) {
        itr->second = std::forward<M>(m);
        return std::pair{itr, false};
      } else {
        grow();
        return std::pair{data.emplace(data.end(), key, std::forward<M>(m)), true};
      }
    }